

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

void png_filter_up(int stride,uchar *in,uchar *out,uchar *prev_line,int len)

{
  long in_RCX;
  void *in_RDX;
  void *in_RSI;
  int in_R8D;
  int i;
  undefined4 local_28;
  
  if (in_RCX == 0) {
    memcpy(in_RDX,in_RSI,(long)in_R8D);
  }
  else {
    for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
      *(char *)((long)in_RDX + (long)local_28) =
           *(char *)((long)in_RSI + (long)local_28) + *(char *)(in_RCX + local_28);
    }
  }
  return;
}

Assistant:

static void png_filter_up(int stride, unsigned char* in, unsigned char* out, unsigned char* prev_line, int len)
{
	int i;

	if(prev_line) 
    { 
        for(i = 0; i < len; i++) 
            out[i] = in[i] + prev_line[i]; 
    } 
    else 
        memcpy(out, in, len);
}